

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-graph.hxx
# Opt level: O0

void __thiscall
lineage::heuristics::PartitionGraph::
PartitionGraph<std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (PartitionGraph *this,Data *data,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *edgeLabels)

{
  _Bit_iterator __last;
  _Bit_iterator __first;
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  _Bit_type *p_Var4;
  size_t sVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  size_t sVar6;
  vector<bool,_std::allocator<bool>_> *this_00;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar7;
  size_t branchingEdgeId;
  size_t f1;
  size_t f0;
  size_t v1;
  size_t v0;
  size_t edge;
  size_t v;
  ComponentsBySearch<const_andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>_&>
  components;
  size_t numberOfComponents;
  size_t in_stack_fffffffffffffe78;
  ProblemGraph *in_stack_fffffffffffffe80;
  Visitor *in_stack_fffffffffffffe88;
  Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_stack_fffffffffffffe90;
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_stack_fffffffffffffe98;
  ComponentsBySearch<const_andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>_&>
  *in_stack_fffffffffffffea0;
  _Bit_type *vertexIndex1;
  PartitionGraph *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  size_t local_90;
  size_t local_88;
  _Bit_type *local_80;
  _Node_iterator_base<unsigned_long,_false> local_78;
  undefined1 local_70;
  ulong local_68;
  undefined1 local_60 [56];
  size_t local_28;
  IdleGraphVisitor<unsigned_long> local_19;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_18;
  undefined8 local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  andres::graph::IdleGraphVisitor<unsigned_long>::IdleGraphVisitor(&local_19);
  andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Digraph
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1be769);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x1be77f);
  *(undefined8 *)(in_RDI + 0x78) = local_10;
  std::
  vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
            *)0x1be7a4);
  sVar6 = in_RDI + 0x98;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1be7c0);
  local_28 = 0;
  andres::graph::
  ComponentsBySearch<const_andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>_&>
  ::ComponentsBySearch
            ((ComponentsBySearch<const_andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>_&>
              *)in_stack_fffffffffffffe80);
  ProblemGraph::graph((ProblemGraph *)**(undefined8 **)(in_RDI + 0x78));
  PartitionGraph<std::vector<unsigned_char,std::allocator<unsigned_char>>>(lineage::Data&,std::
  vector<unsigned_char,std::allocator<unsigned_char>>&)::SubgraphWithCut::SubgraphWithCut(std::
  vector<unsigned_char,std::allocator<unsigned_char>>const&,lineage::ProblemGraph_const__
            (local_60,local_18,(ProblemGraph *)**(undefined8 **)(in_RDI + 0x78));
  local_28 = andres::graph::
             ComponentsBySearch<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>const&>
             ::
             build<lineage::heuristics::PartitionGraph::PartitionGraph<std::vector<unsigned_char,std::allocator<unsigned_char>>>(lineage::Data&,std::vector<unsigned_char,std::allocator<unsigned_char>>&)::SubgraphWithCut>
                       (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                        (SubgraphWithCut *)in_stack_fffffffffffffe90);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),in_stack_ffffffffffffff18
            );
  andres::graph::
  ComponentsBySearch<const_andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>_&>
  ::~ComponentsBySearch
            ((ComponentsBySearch<const_andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>_&>
              *)0x1be876);
  std::
  vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ::resize((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
            *)in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98);
  for (local_68 = 0; uVar1 = local_68,
      sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x98)),
      uVar1 < sVar2; local_68 = local_68 + 1) {
    in_stack_fffffffffffffeb0 = (PartitionGraph *)(in_RDI + 0x80);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x98),
                        local_68);
    std::
    vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
    ::operator[]((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                  *)in_stack_fffffffffffffeb0,*pvVar3);
    pVar7 = std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::insert((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)in_stack_fffffffffffffe90,(value_type *)in_stack_fffffffffffffe88);
    local_78._M_cur =
         (__node_type *)pVar7.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
    in_stack_fffffffffffffebf = pVar7.second;
    local_70 = in_stack_fffffffffffffebf;
  }
  std::
  vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ::size((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
          *)(in_RDI + 0x80));
  andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::insertVertices
            ((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
             CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),sVar6);
  local_80 = (_Bit_type *)0x0;
  while( true ) {
    vertexIndex1 = local_80;
    ProblemGraph::graph((ProblemGraph *)**(undefined8 **)(in_RDI + 0x78));
    p_Var4 = (_Bit_type *)
             andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::numberOfEdges
                       ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x1be9e7);
    if (p_Var4 <= vertexIndex1) break;
    ProblemGraph::graph((ProblemGraph *)**(undefined8 **)(in_RDI + 0x78));
    local_88 = andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::vertexOfEdge
                         ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                          in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,0x1bea20);
    ProblemGraph::graph((ProblemGraph *)**(undefined8 **)(in_RDI + 0x78));
    local_90 = andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::vertexOfEdge
                         ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                          in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,0x1bea54);
    sVar6 = ProblemGraph::frameOfNode(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    sVar5 = ProblemGraph::frameOfNode(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    if (sVar6 != sVar5) {
      if (sVar5 < sVar6) {
        std::swap<unsigned_long>(&local_88,&local_90);
      }
      in_stack_fffffffffffffe90 =
           (Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)(in_RDI + 0x98);
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffe90,local_88);
      in_stack_fffffffffffffe98 = (Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)*pvVar3;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe90,
                 local_90);
      in_stack_fffffffffffffea0 =
           (ComponentsBySearch<const_andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>_&>
            *)andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::insertEdge
                        ((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                         CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                         (size_t)in_stack_fffffffffffffeb0,(size_t)vertexIndex1);
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(*(long *)(in_RDI + 0x78) + 0x20),
                 (size_type)local_80);
      updateEdgeCost(in_stack_fffffffffffffeb0,(size_t)vertexIndex1,
                     (double)in_stack_fffffffffffffea0);
    }
    local_80 = (_Bit_type *)((long)local_80 + 1);
  }
  andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::numberOfEdges
            ((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x1bebcd);
  std::vector<bool,_std::allocator<bool>_>::resize
            ((vector<bool,_std::allocator<bool>_> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (size_type)in_stack_ffffffffffffff18,(bool)in_stack_ffffffffffffff17);
  this_00 = (vector<bool,_std::allocator<bool>_> *)(in_RDI + 0x50);
  std::vector<bool,_std::allocator<bool>_>::begin((vector<bool,_std::allocator<bool>_> *)0x1bebf3);
  std::vector<bool,_std::allocator<bool>_>::end(this_00);
  __first.super__Bit_iterator_base._8_8_ = in_stack_fffffffffffffeb0;
  __first.super__Bit_iterator_base._M_p = vertexIndex1;
  __last.super__Bit_iterator_base._8_8_ = in_stack_fffffffffffffea0;
  __last.super__Bit_iterator_base._M_p = (_Bit_type *)in_stack_fffffffffffffe98;
  std::fill<std::_Bit_iterator,bool>(__first,__last,(bool *)in_stack_fffffffffffffe90);
  return;
}

Assistant:

PartitionGraph(Data& data, ELABELS& edgeLabels)
      : data_(data)
    {
        size_t numberOfComponents{ 0 };

        { // construct vertex labels.

            struct SubgraphWithCut
            { // a subgraph with cut mask
                SubgraphWithCut(const ELABELS& labels,
                                const ProblemGraph& problemGraph)
                  : labels_(labels)
                  , problemGraph_(problemGraph)
                {
                }
                bool vertex(const std::size_t v) const { return true; }
                bool edge(const std::size_t e) const
                {
                    if (labels_[e] == 1)
                        return false;

                    const auto v0 = problemGraph_.graph().vertexOfEdge(e, 0);
                    const auto v1 = problemGraph_.graph().vertexOfEdge(e, 1);
                    if (problemGraph_.frameOfNode(v0) !=
                        problemGraph_.frameOfNode(v1))
                        return false;
                    return true;
                }

                const ELABELS& labels_;
                const ProblemGraph& problemGraph_;
            };

            // build decomposition based on the current multicut
            andres::graph::ComponentsBySearch<decltype(
                this->data_.problemGraph.graph())>
                components;
            numberOfComponents = components.build(
                this->data_.problemGraph.graph(),
                SubgraphWithCut(edgeLabels, this->data_.problemGraph));

            vertexLabels_ = components.labels_;
        }

        // construct partitions from initial labeling.
        partitions_.resize(numberOfComponents);
        for (size_t v = 0; v < vertexLabels_.size(); ++v) {
            partitions_[vertexLabels_[v]].insert(v);
        }

        // construct vertices and edges of branching graph.
        this->insertVertices(partitions_.size());

        for (size_t edge = 0; edge < data_.problemGraph.graph().numberOfEdges();
             ++edge) {
            auto v0 = data_.problemGraph.graph().vertexOfEdge(edge, 0);
            auto v1 = data_.problemGraph.graph().vertexOfEdge(edge, 1);

            const auto f0 = data_.problemGraph.frameOfNode(v0);
            const auto f1 = data_.problemGraph.frameOfNode(v1);

            // skip in-frame edges.
            if (f0 == f1) {
                continue;
            }

            if (f0 > f1) {
                std::swap(v0, v1);
            }

            const auto branchingEdgeId =
                this->insertEdge(vertexLabels_[v0], vertexLabels_[v1]);
            updateEdgeCost(branchingEdgeId,
                           -data_.costs[edge]); // negative costs because
                                                // BranchingOptimizer
                                                // *maximizes*
        }

        // initialize with empty branching.
        branchingLabels_.resize(this->numberOfEdges(), false);
        std::fill(branchingLabels_.begin(), branchingLabels_.end(), false);

#ifdef DEBUG
        std::cout << "Constructed partitionGraph:" << std::endl;
        std::cout << "  " << this->numberOfVertices() << " vertices"
                  << std::endl;
        std::cout << "  " << this->numberOfEdges() << " edges" << std::endl;
        std::cout << "  " << this->data_.problemGraph.graph().numberOfEdges()
                  << " original edges." << std::endl;
#endif
    }